

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_loop_restoration_filter_frame_init
               (AV1LrStruct *lr_ctxt,YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,
               int num_planes)

{
  byte bVar1;
  aom_bit_depth_t aVar2;
  RestorationType RVar3;
  YV12_BUFFER_CONFIG *pYVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  FilterFrameCtxt *pFVar9;
  uint use_highbitdepth;
  long lVar10;
  bool bVar11;
  int plane_h;
  int plane_w;
  int local_58;
  int local_54;
  SequenceHeader *local_50;
  AV1_COMMON *local_48;
  long local_40;
  RestorationInfo *local_38;
  
  local_50 = cm->seq_params;
  aVar2 = local_50->bit_depth;
  bVar1 = local_50->use_highbitdepth;
  lr_ctxt->dst = &cm->rst_frame;
  use_highbitdepth = (uint)bVar1;
  iVar6 = aom_realloc_frame_buffer
                    (&cm->rst_frame,(frame->field_2).field_0.y_crop_width,
                     (frame->field_3).field_0.y_crop_height,local_50->subsampling_x,
                     local_50->subsampling_y,use_highbitdepth,0x20,(cm->features).byte_alignment,
                     (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                     false,0);
  if (iVar6 != 0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate restoration dst buffer");
  }
  lr_ctxt->on_rest_unit = filter_frame_on_unit;
  lr_ctxt->frame = frame;
  if (0 < num_planes) {
    local_38 = cm->rst_info;
    pFVar9 = lr_ctxt->ctxt;
    local_40 = (ulong)(uint)num_planes << 3;
    lVar10 = 0;
    lVar8 = 0;
    local_48 = cm;
    do {
      (&local_38->optimized_lr)[lVar8 * 2] = optimized_lr;
      RVar3 = (&local_38->frame_restoration_type)[lVar8 * 2];
      pFVar9->rsi = (RestorationInfo *)((long)&local_38->frame_restoration_type + lVar10);
      if (RVar3 != RESTORE_NONE) {
        bVar11 = lVar8 != 0;
        av1_get_upsampled_plane_size(cm,(uint)bVar11,&local_54,&local_58);
        iVar5 = local_54;
        iVar6 = local_58;
        av1_extend_frame(*(uint8_t **)((long)frame->store_buf_adr + lVar8 + -0x20),local_54,local_58
                         ,*(int *)((long)frame->store_buf_adr + (ulong)bVar11 * 4 + -0x28),3,3,
                         use_highbitdepth);
        if (lVar8 == 0) {
          pFVar9->ss_x = 0;
          uVar7 = 0;
        }
        else {
          pFVar9->ss_x = (uint)(local_50->subsampling_x != 0);
          uVar7 = (uint)(local_50->subsampling_y != 0);
        }
        pFVar9->ss_y = uVar7;
        pFVar9->plane_w = iVar5;
        pFVar9->plane_h = iVar6;
        pFVar9->highbd = use_highbitdepth;
        pFVar9->bit_depth = aVar2;
        pFVar9->data8 = *(uint8_t **)((long)frame->store_buf_adr + lVar8 + -0x20);
        pYVar4 = lr_ctxt->dst;
        pFVar9->dst8 = *(uint8_t **)((long)pYVar4->store_buf_adr + lVar8 + -0x20);
        pFVar9->data_stride = *(int *)((long)frame->store_buf_adr + (ulong)bVar11 * 4 + -0x28);
        pFVar9->dst_stride = *(int *)((long)pYVar4->store_buf_adr + (ulong)bVar11 * 4 + -0x28);
        cm = local_48;
      }
      lVar8 = lVar8 + 8;
      pFVar9 = pFVar9 + 1;
      lVar10 = lVar10 + 0x40;
    } while (local_40 != lVar8);
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_frame_init(AV1LrStruct *lr_ctxt,
                                            YV12_BUFFER_CONFIG *frame,
                                            AV1_COMMON *cm, int optimized_lr,
                                            int num_planes) {
  const SequenceHeader *const seq_params = cm->seq_params;
  const int bit_depth = seq_params->bit_depth;
  const int highbd = seq_params->use_highbitdepth;
  lr_ctxt->dst = &cm->rst_frame;

  const int frame_width = frame->crop_widths[0];
  const int frame_height = frame->crop_heights[0];
  if (aom_realloc_frame_buffer(
          lr_ctxt->dst, frame_width, frame_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false,
          0) != AOM_CODEC_OK)
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate restoration dst buffer");

  lr_ctxt->on_rest_unit = filter_frame_on_unit;
  lr_ctxt->frame = frame;
  for (int plane = 0; plane < num_planes; ++plane) {
    RestorationInfo *rsi = &cm->rst_info[plane];
    RestorationType rtype = rsi->frame_restoration_type;
    rsi->optimized_lr = optimized_lr;
    lr_ctxt->ctxt[plane].rsi = rsi;

    if (rtype == RESTORE_NONE) {
      continue;
    }

    const int is_uv = plane > 0;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    assert(plane_w == frame->crop_widths[is_uv]);
    assert(plane_h == frame->crop_heights[is_uv]);

    av1_extend_frame(frame->buffers[plane], plane_w, plane_h,
                     frame->strides[is_uv], RESTORATION_BORDER,
                     RESTORATION_BORDER, highbd);

    FilterFrameCtxt *lr_plane_ctxt = &lr_ctxt->ctxt[plane];
    lr_plane_ctxt->ss_x = is_uv && seq_params->subsampling_x;
    lr_plane_ctxt->ss_y = is_uv && seq_params->subsampling_y;
    lr_plane_ctxt->plane_w = plane_w;
    lr_plane_ctxt->plane_h = plane_h;
    lr_plane_ctxt->highbd = highbd;
    lr_plane_ctxt->bit_depth = bit_depth;
    lr_plane_ctxt->data8 = frame->buffers[plane];
    lr_plane_ctxt->dst8 = lr_ctxt->dst->buffers[plane];
    lr_plane_ctxt->data_stride = frame->strides[is_uv];
    lr_plane_ctxt->dst_stride = lr_ctxt->dst->strides[is_uv];
  }
}